

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O0

void print_AttributeInfo(attribute_info attributeInfo,uint32_t index,cp_info *constantPool,
                        uint8_t indentation)

{
  undefined4 uVar1;
  u1 *puVar2;
  ulong uVar3;
  Code_attribute codeAttribute;
  attribute_info attributeInfo_00;
  ulong uVar4;
  FILE *pFVar5;
  undefined1 auVar6 [54];
  undefined2 uVar7;
  undefined8 uVar8;
  bool bVar9;
  char *pcVar10;
  ostream *this;
  char *str;
  CONSTANT_Utf8_info constant;
  CONSTANT_Utf8_info constant_00;
  CONSTANT_Utf8_info constant_01;
  CONSTANT_Utf8_info constant_02;
  CONSTANT_Utf8_info constant_03;
  CONSTANT_Utf8_info constant_04;
  CONSTANT_Utf8_info constant_05;
  CONSTANT_Utf8_info constant_06;
  CONSTANT_Utf8_info constant_07;
  u2 uStack_1e0;
  u2 uStack_1de;
  LocalVariableTable variable;
  uint16_t i_5;
  LocalVariableTable_attribute localVariable;
  ushort local_1b6;
  ushort uStack_1b4;
  ushort local_1b2;
  ushort uStack_1b0;
  LineNumberTable table;
  uint16_t i_4;
  LineNumberTable_attribute lineNumberTable;
  SourceFile_attribute sourceFile;
  u2 local_162;
  u2 uStack_160;
  u2 uStack_15e;
  u2 uStack_15c;
  Class innerClass;
  uint16_t i_3;
  InnerClasses_attribute innerClassAttr;
  ushort local_132;
  ushort uStack_130;
  uint16_t i_2;
  Exceptions_attribute exceptionsAttr;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  ushort local_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined4 uStack_cc;
  uint16_t i_1;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  attribute_info *paStack_a8;
  undefined8 local_9a;
  ExceptionTable exceptionTable;
  uint16_t i;
  Code_attribute code;
  ConstantValue_attribute constantValue;
  CONSTANT_Utf8_info attributeUtf8;
  char *attributeName;
  uint8_t indentation_local;
  cp_info *constantPool_local;
  uint32_t index_local;
  
  pcVar10 = getFormattedConstant(constantPool,attributeInfo.attribute_name_index);
  Utils::printTabs(out,indentation);
  fprintf((FILE *)out,"[%d] %s\n",(ulong)index,pcVar10);
  Utils::printTabs(out,indentation + '\x01');
  fprintf((FILE *)out,"Attribute name index:\t cp_info #%d\n",
          (ulong)attributeInfo.attribute_name_index);
  Utils::printTabs(out,indentation + '\x01');
  fprintf((FILE *)out,"Attribute length:\t %d\n",(ulong)attributeInfo.attribute_length);
  pcVar10 = *(char **)&constantPool[(int)(attributeInfo.attribute_name_index - 1)].info;
  puVar2 = constantPool[(int)(attributeInfo.attribute_name_index - 1)].info.utf8_info.bytes;
  constant.bytes = (u1 *)"ConstantValue";
  constant._0_8_ = puVar2;
  str = pcVar10;
  bVar9 = Utils::compareUtf8WithString((Utils *)((ulong)pcVar10 & 0xffff),constant,pcVar10);
  if (bVar9) {
    uVar7 = attributeInfo.info.code_info.max_stack;
    Utils::printTabs(out,indentation + '\x01');
    pFVar5 = out;
    pcVar10 = getFormattedConstant(constantPool,uVar7);
    fprintf((FILE *)pFVar5,"Constant value index:\t cp_info #%d <%s>\n",(ulong)(ushort)uVar7,pcVar10
           );
  }
  else {
    constant_00.bytes = (u1 *)"Code";
    constant_00._0_8_ = puVar2;
    bVar9 = Utils::compareUtf8WithString((Utils *)((ulong)pcVar10 & 0xffff),constant_00,str);
    if (bVar9) {
      memcpy(&exceptionTable.end_pc,&attributeInfo.info,0x30);
      Utils::printTabs(out,indentation + '\x01');
      fprintf((FILE *)out,"Maximum stack depth:\t %d\n",(ulong)exceptionTable.end_pc);
      Utils::printTabs(out,indentation + '\x01');
      fprintf((FILE *)out,"Maximum local variables: %d\n",(ulong)exceptionTable.handler_pc);
      Utils::printTabs(out,indentation + '\x01');
      fprintf((FILE *)out,"Code length:\t\t %u\n",(ulong)stack0xffffffffffffff74);
      Utils::printTabs(out,indentation + '\x01');
      fprintf((FILE *)out,"Exception table:\n");
      Utils::printTabs(out,indentation + '\x02');
      if ((ushort)code.code == 0) {
        fprintf((FILE *)out,"Exception table is empty.\n");
      }
      else {
        fprintf((FILE *)out,"Nr.\t start_pc\t end_pc\t handler_pc\t catch_type\t verbose\n");
        for (exceptionTable.start_pc = 0; exceptionTable.start_pc < (ushort)code.code;
            exceptionTable.start_pc = exceptionTable.start_pc + 1) {
          local_9a = *(ulong *)(code._16_8_ + (ulong)exceptionTable.start_pc * 8);
          Utils::printTabs(out,indentation + '\x02');
          fprintf((FILE *)out,"%d\t ",(ulong)exceptionTable.start_pc);
          fprintf((FILE *)out,"%d\t ",local_9a & 0xffff);
          fprintf((FILE *)out,"%d\t ",local_9a >> 0x10 & 0xffff);
          fprintf((FILE *)out,"%d\t ",local_9a >> 0x20 & 0xffff);
          if (local_9a._6_2_ == 0) {
            fprintf((FILE *)out,"0\n");
          }
          else {
            fprintf((FILE *)out,"cp_info #%d\t ",(ulong)local_9a._6_2_);
            pFVar5 = out;
            pcVar10 = getFormattedConstant(constantPool,local_9a._6_2_);
            fprintf((FILE *)pFVar5,"%s\n",pcVar10);
          }
        }
      }
      Utils::printTabs(out,indentation + '\x01');
      fprintf((FILE *)out,"Bytecode:\n");
      memcpy(&stack0xffffffffffffff30,&exceptionTable.end_pc,0x30);
      codeAttribute.code = (u1 *)uStack_c8;
      codeAttribute.max_stack = uStack_d0;
      codeAttribute.max_locals = uStack_ce;
      codeAttribute.code_length = uStack_cc;
      codeAttribute._16_8_ = local_c0;
      codeAttribute.exception_table = (ExceptionTable *)uStack_b8;
      codeAttribute._32_8_ = local_b0;
      codeAttribute.attributes = paStack_a8;
      printByteCode(codeAttribute,constantPool,indentation + '\x02');
      Utils::printTabs(out,indentation + '\x01');
      fprintf((FILE *)out,"Attributes:\n");
      for (local_d2 = 0; local_d2 < (ushort)code.exception_table; local_d2 = local_d2 + 1) {
        memcpy(&local_110,(void *)(code._32_8_ + (ulong)local_d2 * 0x38),0x38);
        attributeInfo_00.info._0_8_ = uStack_108;
        attributeInfo_00.attribute_name_index = (undefined2)local_110;
        attributeInfo_00._2_2_ = local_110._2_2_;
        attributeInfo_00.attribute_length = local_110._4_4_;
        attributeInfo_00.info.code_info.code = (u1 *)local_100;
        attributeInfo_00.info._16_8_ = uStack_f8;
        attributeInfo_00.info.code_info.exception_table = (ExceptionTable *)local_f0;
        attributeInfo_00.info._32_8_ = uStack_e8;
        attributeInfo_00.info.code_info.attributes = (attribute_info *)local_e0;
        print_AttributeInfo(attributeInfo_00,(uint)local_d2,constantPool,indentation + '\x02');
      }
    }
    else {
      constant_01.bytes = (u1 *)"Exceptions";
      constant_01._0_8_ = puVar2;
      bVar9 = Utils::compareUtf8WithString((Utils *)((ulong)pcVar10 & 0xffff),constant_01,str);
      auVar6 = (undefined1  [54])attributeInfo._2_54_;
      if (bVar9) {
        uVar8 = attributeInfo.info.code_info.code;
        Utils::printTabs(out,indentation + '\x01');
        fprintf((FILE *)out,"Nr.\t exception\t verbose\n");
        for (local_132 = 0; uStack_130 = auVar6._6_2_, local_132 < uStack_130;
            local_132 = local_132 + 1) {
          Utils::printTabs(out,indentation + '\x01');
          fprintf((FILE *)out,"%d\t ",(ulong)local_132);
          fprintf((FILE *)out,"cp_info #%d\t ",(ulong)*(ushort *)(uVar8 + (ulong)local_132 * 2));
          pFVar5 = out;
          pcVar10 = getFormattedConstant(constantPool,*(u2 *)(uVar8 + (ulong)local_132 * 2));
          fprintf((FILE *)pFVar5,"%s\n",pcVar10);
        }
      }
      else {
        constant_02.bytes = (u1 *)"InnerClasses";
        constant_02._0_8_ = puVar2;
        bVar9 = Utils::compareUtf8WithString((Utils *)((ulong)pcVar10 & 0xffff),constant_02,str);
        auVar6 = (undefined1  [54])attributeInfo._2_54_;
        if (bVar9) {
          uVar8 = attributeInfo.info.code_info.code;
          Utils::printTabs(out,indentation + '\x01');
          fprintf((FILE *)out,"Nr.\t inner_class\t outer_class\t inner_name\t access flags\n");
          for (innerClass.inner_class_info_index = 0;
              innerClass.outer_class_info_index = auVar6._6_2_,
              innerClass.inner_class_info_index < innerClass.outer_class_info_index;
              innerClass.inner_class_info_index = innerClass.inner_class_info_index + 1) {
            uVar3 = *(ulong *)(uVar8 + (ulong)innerClass.inner_class_info_index * 8);
            Utils::printTabs(out,indentation + '\x01');
            fprintf((FILE *)out,"%d\t ",(ulong)innerClass.inner_class_info_index);
            pFVar5 = out;
            local_162 = (u2)uVar3;
            pcVar10 = getFormattedConstant(constantPool,local_162);
            fprintf((FILE *)pFVar5,"cp_info #%d <%s>\t ",uVar3 & 0xffff,pcVar10);
            pFVar5 = out;
            uStack_160 = (u2)(uVar3 >> 0x10);
            pcVar10 = getFormattedConstant(constantPool,uStack_160);
            fprintf((FILE *)pFVar5,"cp_info #%d <%s>\t ",(ulong)uStack_160,pcVar10);
            pFVar5 = out;
            uStack_15e = (u2)(uVar3 >> 0x20);
            pcVar10 = getFormattedConstant(constantPool,uStack_15e);
            fprintf((FILE *)pFVar5,"cp_info #%d <%s>\t ",(ulong)uStack_15e,pcVar10);
            pFVar5 = out;
            uStack_15c = (u2)(uVar3 >> 0x30);
            pcVar10 = getAccessFlags(uStack_15c);
            fprintf((FILE *)pFVar5,"0x%.4X [%s]\n",(ulong)uStack_15c,pcVar10);
          }
        }
        else {
          constant_03.bytes = (u1 *)"Synthetic";
          constant_03._0_8_ = puVar2;
          bVar9 = Utils::compareUtf8WithString((Utils *)((ulong)pcVar10 & 0xffff),constant_03,str);
          if (!bVar9) {
            constant_04.bytes = (u1 *)"SourceFile";
            constant_04._0_8_ = puVar2;
            bVar9 = Utils::compareUtf8WithString((Utils *)((ulong)pcVar10 & 0xffff),constant_04,str)
            ;
            if (bVar9) {
              uVar7 = attributeInfo.info.code_info.max_stack;
              Utils::printTabs(out,indentation + '\x01');
              pFVar5 = out;
              pcVar10 = getFormattedConstant(constantPool,uVar7);
              fprintf((FILE *)pFVar5,"Constant value index:\t cp_info #%d <%s>\n",
                      (ulong)(ushort)uVar7,pcVar10);
            }
            else {
              constant_05.bytes = (u1 *)"LineNumberTable";
              constant_05._0_8_ = puVar2;
              bVar9 = Utils::compareUtf8WithString
                                ((Utils *)((ulong)pcVar10 & 0xffff),constant_05,str);
              auVar6 = (undefined1  [54])attributeInfo._2_54_;
              if (bVar9) {
                uVar8 = attributeInfo.info.code_info.code;
                Utils::printTabs(out,indentation + '\x01');
                fprintf((FILE *)out,"Nr.\t start_pc\t line_number\n");
                for (local_1b2 = 0; uStack_1b0 = auVar6._6_2_, local_1b2 < uStack_1b0;
                    local_1b2 = local_1b2 + 1) {
                  uVar1 = *(undefined4 *)(uVar8 + (ulong)local_1b2 * 4);
                  Utils::printTabs(out,indentation + '\x01');
                  fprintf((FILE *)out,"%d\t ",(ulong)local_1b2);
                  local_1b6 = (ushort)uVar1;
                  fprintf((FILE *)out,"%d\t ",(ulong)local_1b6);
                  uStack_1b4 = (ushort)((uint)uVar1 >> 0x10);
                  fprintf((FILE *)out,"%d\n",(ulong)uStack_1b4);
                }
              }
              else {
                constant_06.bytes = (u1 *)"LocalVariableTable";
                constant_06._0_8_ = puVar2;
                bVar9 = Utils::compareUtf8WithString
                                  ((Utils *)((ulong)pcVar10 & 0xffff),constant_06,str);
                auVar6 = (undefined1  [54])attributeInfo._2_54_;
                if (bVar9) {
                  uVar8 = attributeInfo.info.code_info.code;
                  Utils::printTabs(out,indentation + '\x01');
                  fprintf((FILE *)out,"Nr.\t start_pc\t length\t index\t name\t descriptor\n");
                  for (variable.length = 0; variable.name_index = auVar6._6_2_,
                      variable.length < variable.name_index; variable.length = variable.length + 1)
                  {
                    uVar3 = *(ulong *)(uVar8 + (ulong)variable.length * 10);
                    uVar4 = ((ulong *)(uVar8 + (ulong)variable.length * 10))[1];
                    Utils::printTabs(out,indentation + '\x01');
                    fprintf((FILE *)out,"%d\t ",(ulong)variable.length);
                    fprintf((FILE *)out,"%d\t ",uVar3 & 0xffff);
                    fprintf((FILE *)out,"%d\t ",uVar3 >> 0x10 & 0xffff);
                    fprintf((FILE *)out,"%d\t ",(ulong)(ushort)uVar4);
                    pFVar5 = out;
                    uStack_1e0 = (u2)(uVar3 >> 0x20);
                    pcVar10 = getFormattedConstant(constantPool,uStack_1e0);
                    fprintf((FILE *)pFVar5,"cp_info #%d <%s>\t ",(ulong)uStack_1e0,pcVar10);
                    pFVar5 = out;
                    uStack_1de = (u2)(uVar3 >> 0x30);
                    pcVar10 = getFormattedConstant(constantPool,uStack_1de);
                    fprintf((FILE *)pFVar5,"cp_info #%d <%s>\n",(ulong)uStack_1de,pcVar10);
                  }
                }
                else {
                  constant_07.bytes = (u1 *)"Deprecated";
                  constant_07._0_8_ = puVar2;
                  bVar9 = Utils::compareUtf8WithString
                                    ((Utils *)((ulong)pcVar10 & 0xffff),constant_07,str);
                  if (!bVar9) {
                    this = std::operator<<((ostream *)&std::cerr,
                                           "Arquivo .class possui uma um atributo invalido.");
                    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
                    exit(6);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf((FILE *)out,"\n");
  return;
}

Assistant:

void print_AttributeInfo(attribute_info attributeInfo, uint32_t index, cp_info *constantPool, uint8_t indentation) {    
    const char *attributeName = getFormattedConstant(constantPool, attributeInfo.attribute_name_index);
    Utils::printTabs(out, indentation);
    fprintf(out,"[%d] %s\n", index, attributeName);
    Utils::printTabs(out, indentation+1);
    fprintf(out,"Attribute name index:\t cp_info #%d\n", attributeInfo.attribute_name_index);
    Utils::printTabs(out, indentation+1);
    fprintf(out,"Attribute length:\t %d\n", attributeInfo.attribute_length);
    
    CONSTANT_Utf8_info attributeUtf8 = constantPool[attributeInfo.attribute_name_index-1].info.utf8_info;
    if (Utils::compareUtf8WithString(attributeUtf8, "ConstantValue")) {
        ConstantValue_attribute constantValue = attributeInfo.info.constantValue_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Constant value index:\t cp_info #%d <%s>\n", constantValue.constantvalue_index, getFormattedConstant(constantPool, constantValue.constantvalue_index));
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Code")) {
        Code_attribute code = attributeInfo.info.code_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Maximum stack depth:\t %d\n", code.max_stack);
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Maximum local variables: %d\n", code.max_locals);
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Code length:\t\t %u\n", code.code_length);
        
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Exception table:\n");
        Utils::printTabs(out, indentation+2);
        if (code.exception_table_length > 0) {
            fprintf(out,"Nr.\t start_pc\t end_pc\t handler_pc\t catch_type\t verbose\n");
            for (uint16_t i = 0; i < code.exception_table_length; i++) {
                ExceptionTable exceptionTable = code.exception_table[i];
                Utils::printTabs(out, indentation+2);
                fprintf(out,"%d\t ", i);
                fprintf(out,"%d\t ", exceptionTable.start_pc);
                fprintf(out,"%d\t ", exceptionTable.end_pc);
                fprintf(out,"%d\t ", exceptionTable.handler_pc);
                if (exceptionTable.catch_type == 0) {
                    fprintf(out,"0\n");
                } else {
                    fprintf(out,"cp_info #%d\t ", exceptionTable.catch_type);
                    fprintf(out,"%s\n", getFormattedConstant(constantPool, exceptionTable.catch_type));
                }
            }
        } else {
            fprintf(out,"Exception table is empty.\n");
        }
        
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Bytecode:\n");
        printByteCode(code, constantPool, indentation+2);
        
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Attributes:\n");
        for (uint16_t i = 0; i < code.attributes_count; i++) {
            print_AttributeInfo(code.attributes[i], i, constantPool, indentation+2);
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Exceptions")) {
        Exceptions_attribute exceptionsAttr = attributeInfo.info.exceptions_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t exception\t verbose\n");
        for (uint16_t i = 0; i < exceptionsAttr.number_of_exceptions; i++) {
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"cp_info #%d\t ", exceptionsAttr.exception_index_table[i]);
            fprintf(out,"%s\n", getFormattedConstant(constantPool, exceptionsAttr.exception_index_table[i]));
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "InnerClasses")) {
        InnerClasses_attribute innerClassAttr = attributeInfo.info.innerClasses_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t inner_class\t outer_class\t inner_name\t access flags\n");
        for (uint16_t i = 0; i < innerClassAttr.number_of_classes; i++) {
            Class innerClass = innerClassAttr.classes[i];
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"cp_info #%d <%s>\t ", innerClass.inner_class_info_index, getFormattedConstant(constantPool, innerClass.inner_class_info_index));
            fprintf(out,"cp_info #%d <%s>\t ", innerClass.outer_class_info_index, getFormattedConstant(constantPool, innerClass.outer_class_info_index));
            fprintf(out,"cp_info #%d <%s>\t ", innerClass.inner_name_index, getFormattedConstant(constantPool, innerClass.inner_name_index));
            fprintf(out,"0x%.4X [%s]\n", innerClass.inner_class_access_flags, getAccessFlags(innerClass.inner_class_access_flags));
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Synthetic")) {
        // vazio
    } else if (Utils::compareUtf8WithString(attributeUtf8, "SourceFile")) {
        SourceFile_attribute sourceFile = attributeInfo.info.sourceFile_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Constant value index:\t cp_info #%d <%s>\n", sourceFile.sourcefile_index, getFormattedConstant(constantPool, sourceFile.sourcefile_index));
    } else if (Utils::compareUtf8WithString(attributeUtf8, "LineNumberTable")) {
        LineNumberTable_attribute lineNumberTable = attributeInfo.info.lineNumberTable_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t start_pc\t line_number\n");
        for (uint16_t i = 0; i < lineNumberTable.line_number_table_length; i++) {
            LineNumberTable table = lineNumberTable.line_number_table[i];
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"%d\t ", table.start_pc);
            fprintf(out,"%d\n", table.line_number);
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "LocalVariableTable")) {
        LocalVariableTable_attribute localVariable = attributeInfo.info.localVariableTable_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t start_pc\t length\t index\t name\t descriptor\n");
        for (uint16_t i = 0; i < localVariable.local_variable_table_length; i++) {
            LocalVariableTable variable = localVariable.localVariableTable[i];
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"%d\t ", variable.start_pc);
            fprintf(out,"%d\t ", variable.length);
            fprintf(out,"%d\t ", variable.index);
            fprintf(out,"cp_info #%d <%s>\t ", variable.name_index, getFormattedConstant(constantPool, variable.name_index));
            fprintf(out,"cp_info #%d <%s>\n", variable.descriptor_index, getFormattedConstant(constantPool, variable.descriptor_index));
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Deprecated")) {
        // vazio
    } else {
        cerr << "Arquivo .class possui uma um atributo invalido." << endl;
        exit(6);
    }
    fprintf(out, "\n");
}